

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *cookies;
  curl_slist *list;
  int iVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  Cookie *pCVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  char *pcVar8;
  undefined8 unaff_R12;
  size_t __nmemb;
  bool bVar9;
  FILE *out;
  CURLcode local_54;
  FILE *local_50;
  char *local_48;
  undefined4 local_40;
  uint local_3c;
  char *local_38;
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup) && (list = (data->state).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->state).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    goto LAB_00551584;
  }
  if ((data->state).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  cookies = data->cookies;
  pcVar5 = (data->set).str[5];
  local_50 = (FILE *)0x0;
  local_48 = (char *)0x0;
  local_54 = CURLE_OK;
  if (cookies != (CookieInfo *)0x0) {
    remove_expired(cookies);
    iVar1 = strcmp("-",pcVar5);
    if (iVar1 == 0) {
      local_50 = _stdout;
      uVar4 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
LAB_00551397:
      fputs("# Netscape HTTP Cookie File\n# https://curl.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
            ,local_50);
      if (cookies->numcookies != 0) {
        local_3c = (uint)uVar4;
        pcVar2 = (char *)(*Curl_ccalloc)(1,cookies->numcookies << 3);
        if (pcVar2 == (char *)0x0) {
          bVar9 = true;
          local_54 = CURLE_OUT_OF_MEMORY;
        }
        else {
          lVar3 = 0;
          __nmemb = 0;
          do {
            for (pCVar6 = cookies->cookies[lVar3]; pCVar6 != (Cookie *)0x0; pCVar6 = pCVar6->next) {
              if (pCVar6->domain != (char *)0x0) {
                *(Cookie **)(pcVar2 + __nmemb * 8) = pCVar6;
                __nmemb = __nmemb + 1;
              }
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x100);
          local_40 = (undefined4)CONCAT71(in_register_00000031,cleanup);
          local_38 = pcVar5;
          qsort(pcVar2,__nmemb,8,cookie_sort_ct);
          local_54 = CURLE_OK;
          if (__nmemb != 0) {
            local_54 = CURLE_OK;
            uVar4 = 0;
            uVar7 = 1;
            do {
              pcVar5 = get_netscape_format(*(Cookie **)(pcVar2 + uVar4 * 8));
              bVar9 = pcVar5 == (char *)0x0;
              if (bVar9) {
                local_54 = CURLE_OUT_OF_MEMORY;
                pcVar8 = pcVar2;
              }
              else {
                curl_mfprintf((FILE *)local_50,"%s\n",pcVar5);
                pcVar8 = pcVar5;
              }
              (*Curl_cfree)(pcVar8);
              if (pcVar5 == (char *)0x0) {
                cleanup = SUB41(local_40,0);
                pcVar5 = local_38;
                goto LAB_005514d9;
              }
              bVar9 = uVar7 < __nmemb;
              uVar4 = uVar7;
              uVar7 = (ulong)((int)uVar7 + 1);
            } while (bVar9);
          }
          (*Curl_cfree)(pcVar2);
          cleanup = SUB41(local_40,0);
          bVar9 = false;
          pcVar5 = local_38;
        }
LAB_005514d9:
        uVar4 = (ulong)local_3c;
        if (bVar9) goto LAB_00551524;
        local_54 = CURLE_OK;
        if (bVar9) goto LAB_00551559;
      }
      local_54 = CURLE_OK;
      if ((char)uVar4 == '\0') {
        fclose(local_50);
        local_50 = (FILE *)0x0;
        if ((local_48 != (char *)0x0) && (iVar1 = Curl_rename(local_48,pcVar5), iVar1 != 0)) {
          unlink(local_48);
          local_54 = CURLE_WRITE_ERROR;
          goto LAB_00551524;
        }
      }
      (*Curl_cfree)(local_48);
    }
    else {
      local_54 = Curl_fopen(data,pcVar5,(FILE **)&local_50,&local_48);
      uVar4 = 0;
      if (local_54 == CURLE_OK) goto LAB_00551397;
LAB_00551524:
      if ((local_50 != (FILE *)0x0) && ((char)uVar4 == '\0')) {
        fclose(local_50);
      }
      (*Curl_cfree)(local_48);
    }
  }
LAB_00551559:
  if (local_54 != CURLE_OK) {
    pcVar5 = (data->set).str[5];
    pcVar2 = curl_easy_strerror(local_54);
    Curl_infof(data,"WARNING: failed to save cookies in %s: %s",pcVar5,pcVar2);
  }
LAB_00551584:
  if ((cleanup != false) &&
     ((data->share == (Curl_share *)0x0 || (data->cookies != data->share->cookies)))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = (CookieInfo *)0x0;
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  CURLcode res;

  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->state.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    res = cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]);
    if(res)
      infof(data, "WARNING: failed to save cookies in %s: %s",
            data->set.str[STRING_COOKIEJAR], curl_easy_strerror(res));
  }
  else {
    if(cleanup && data->state.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->state.cookielist); /* clean up list */
      data->state.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}